

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

QVersionNumber __thiscall
QVersionNumber::commonPrefix(QVersionNumber *this,QVersionNumber *v1,QVersionNumber *v2)

{
  byte bVar1;
  byte bVar2;
  QList<int> *pQVar3;
  QList<int> *pQVar4;
  int iVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  long lVar8;
  long size;
  int iVar9;
  
  bVar1 = (v1->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    qVar7 = (((v1->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    qVar7 = (qsizetype)((char)bVar1 >> 1);
  }
  bVar2 = (v2->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    qVar6 = (((v2->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    qVar6 = (qsizetype)((char)bVar2 >> 1);
  }
  if (qVar7 < qVar6) {
    qVar6 = qVar7;
  }
  if (qVar6 < 1) {
    size = 0;
  }
  else {
    pQVar3 = (v1->m_segments).field_0.pointer_segments;
    pQVar4 = (v2->m_segments).field_0.pointer_segments;
    lVar8 = 0;
    do {
      qVar7 = (long)((char)bVar1 >> 1);
      if ((bVar1 & 1) == 0) {
        qVar7 = (pQVar3->d).size;
      }
      iVar5 = 0;
      if (lVar8 < qVar7) {
        if ((bVar1 & 1) == 0) {
          iVar5 = (pQVar3->d).ptr[lVar8];
        }
        else {
          iVar5 = (int)(v1->m_segments).field_0.inline_segments[lVar8 + 1];
        }
      }
      qVar7 = (long)((char)bVar2 >> 1);
      if ((bVar2 & 1) == 0) {
        qVar7 = (pQVar4->d).size;
      }
      iVar9 = 0;
      if (lVar8 < qVar7) {
        if ((bVar2 & 1) == 0) {
          iVar9 = (pQVar4->d).ptr[lVar8];
        }
        else {
          iVar9 = (int)(v2->m_segments).field_0.inline_segments[lVar8 + 1];
        }
      }
      size = lVar8;
    } while ((iVar5 == iVar9) && (lVar8 = lVar8 + 1, size = qVar6, qVar6 != lVar8));
  }
  if (size == 0) {
    (this->m_segments).field_0.dummy = 1;
  }
  else {
    (this->m_segments).field_0.pointer_segments = (QList<int> *)&DAT_aaaaaaaaaaaaaaaa;
    if ((bVar1 & 1) == 0) {
      v1 = v2;
    }
    SegmentStorage::SegmentStorage(&this->m_segments,&v1->m_segments);
    if (((this->m_segments).field_0.inline_segments[0] & 1U) == 0) {
      QList<int>::resize((this->m_segments).field_0.pointer_segments,size);
    }
    else {
      (this->m_segments).field_0.inline_segments[0] = (char)size * '\x02' + '\x01';
    }
  }
  return (QVersionNumber)(SegmentStorage)this;
}

Assistant:

QVersionNumber QVersionNumber::commonPrefix(const QVersionNumber &v1,
                                            const QVersionNumber &v2)
{
    qsizetype commonlen = qMin(v1.segmentCount(), v2.segmentCount());
    qsizetype i;
    for (i = 0; i < commonlen; ++i) {
        if (v1.segmentAt(i) != v2.segmentAt(i))
            break;
    }

    if (i == 0)
        return QVersionNumber();

    // try to use the one with inline segments, if there's one
    QVersionNumber result(!v1.m_segments.isUsingPointer() ? v1 : v2);
    result.m_segments.resize(i);
    return result;
}